

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall SQVM::Init(SQVM *this,SQVM *friendvm,SQInteger stacksize)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQSharedState *ss;
  SQTable *pSVar5;
  CallInfo local_68;
  
  local_68._ip = (SQInstruction *)CONCAT44(local_68._ip._4_4_,0x1000001);
  local_68._literals = (SQObjectPtr *)0x0;
  sqvector<SQObjectPtr>::resize(&this->_stack,stacksize,(SQObjectPtr *)&local_68);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
  this->_alloccallsstacksize = 4;
  local_68._closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_68._prevtop = 0;
  local_68._target = 0;
  local_68._ncalls = 0;
  local_68._60_4_ = 0;
  local_68._generator = (SQGenerator *)0x0;
  local_68._etraps = 0;
  local_68._prevstkbase = 0;
  local_68._ip = (SQInstruction *)0x0;
  local_68._literals = (SQObjectPtr *)0x0;
  local_68._root = 0;
  local_68._closure.super_SQObject._type = OT_NULL;
  local_68._closure.super_SQObject._4_4_ = 0;
  sqvector<SQVM::CallInfo>::resize(&this->_callstackdata,4,&local_68);
  SQObjectPtr::~SQObjectPtr(&local_68._closure);
  this->_callsstacksize = 0;
  this->_callsstack = (this->_callstackdata)._vals;
  this->_top = 0;
  this->_stackbase = 0;
  if (friendvm == (SQVM *)0x0) {
    ss = this->_sharedstate;
    pSVar5 = (SQTable *)sq_vm_malloc(0x58);
    SQTable::SQTable(pSVar5,ss,0);
    (pSVar5->super_SQDelegable)._delegate = (SQTable *)0x0;
    pSVar4 = (this->_roottable).super_SQObject._unVal.pTable;
    SVar2 = (this->_roottable).super_SQObject._type;
    (this->_roottable).super_SQObject._type = OT_TABLE;
    (this->_roottable).super_SQObject._unVal.pTable = pSVar5;
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    sq_base_register(this);
  }
  else {
    SVar2 = (this->_roottable).super_SQObject._type;
    pSVar4 = (this->_roottable).super_SQObject._unVal.pTable;
    pSVar5 = (friendvm->_roottable).super_SQObject._unVal.pTable;
    (this->_roottable).super_SQObject._unVal.pTable = pSVar5;
    SVar3 = (friendvm->_roottable).super_SQObject._type;
    (this->_roottable).super_SQObject._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    SVar2 = (this->_errorhandler).super_SQObject._type;
    pSVar4 = (this->_errorhandler).super_SQObject._unVal.pTable;
    pSVar5 = (friendvm->_errorhandler).super_SQObject._unVal.pTable;
    (this->_errorhandler).super_SQObject._unVal.pTable = pSVar5;
    SVar3 = (friendvm->_errorhandler).super_SQObject._type;
    (this->_errorhandler).super_SQObject._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    this->_debughook = friendvm->_debughook;
    this->_debughook_native = friendvm->_debughook_native;
    SVar2 = (this->_debughook_closure).super_SQObject._type;
    pSVar4 = (this->_debughook_closure).super_SQObject._unVal.pTable;
    pSVar5 = (friendvm->_debughook_closure).super_SQObject._unVal.pTable;
    (this->_debughook_closure).super_SQObject._unVal.pTable = pSVar5;
    SVar3 = (friendvm->_debughook_closure).super_SQObject._type;
    (this->_debughook_closure).super_SQObject._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return true;
}

Assistant:

bool SQVM::Init(SQVM *friendvm, SQInteger stacksize)
{
    _stack.resize(stacksize);
    _alloccallsstacksize = 4;
    _callstackdata.resize(_alloccallsstacksize);
    _callsstacksize = 0;
    _callsstack = &_callstackdata[0];
    _stackbase = 0;
    _top = 0;
    if(!friendvm) {
        _roottable = SQTable::Create(_ss(this), 0);
        sq_base_register(this);
    }
    else {
        _roottable = friendvm->_roottable;
        _errorhandler = friendvm->_errorhandler;
        _debughook = friendvm->_debughook;
        _debughook_native = friendvm->_debughook_native;
        _debughook_closure = friendvm->_debughook_closure;
    }


    return true;
}